

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall RPCResult::CheckInnerDoc(RPCResult *this)

{
  long lVar1;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_0000001c;
  bool inner_needed;
  bool *in_stack_00000028;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&(in_RDI->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
               super__Vector_impl_data._M_start != 0) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::empty(in_RDI);
    inline_check_non_fatal<bool>
              (in_stack_00000028,(char *)this,in_stack_0000001c,in_stack_00000010,in_stack_00000008)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RPCResult::CheckInnerDoc() const
{
    if (m_type == Type::OBJ) {
        // May or may not be empty
        return;
    }
    // Everything else must either be empty or not
    const bool inner_needed{m_type == Type::ARR || m_type == Type::ARR_FIXED || m_type == Type::OBJ_DYN};
    CHECK_NONFATAL(inner_needed != m_inner.empty());
}